

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O1

int pushline(lua_State *L,int firstline)

{
  int iVar1;
  size_t sVar2;
  char *b;
  char *pcVar3;
  char buffer [512];
  undefined8 uStack_230;
  char local_228;
  undefined1 local_227 [519];
  
  pcVar3 = "_PROMPT";
  if (firstline == 0) {
    pcVar3 = "_PROMPT2";
  }
  uStack_230 = 0x1031a4;
  iVar1 = lua_getglobal(L,pcVar3);
  if (iVar1 == 0) {
    pcVar3 = "> ";
    if (firstline == 0) {
      pcVar3 = ">> ";
    }
  }
  else {
    uStack_230 = 0x1031b7;
    pcVar3 = (char *)luaL_tolstring(L,0xffffffff,0);
    uStack_230 = 0x1031cc;
    lua_rotate(L,0xfffffffe,0xffffffff);
    uStack_230 = 0x1031d9;
    lua_settop(L,0xfffffffe);
  }
  uStack_230 = 0x103201;
  fputs(pcVar3,_stdout);
  uStack_230 = 0x103209;
  fflush(_stdout);
  uStack_230 = 0x103220;
  pcVar3 = fgets(&local_228,0x200,_stdin);
  if (pcVar3 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    uStack_230 = 0x103232;
    lua_settop(L,0xfffffffe);
    uStack_230 = 0x10323a;
    sVar2 = strlen(&local_228);
    if (sVar2 == 0) {
      sVar2 = 0;
    }
    else if (*(char *)((long)&uStack_230 + sVar2 + 7) == '\n') {
      *(undefined1 *)((long)&uStack_230 + sVar2 + 7) = 0;
      sVar2 = sVar2 - 1;
    }
    if ((firstline == 0) || (local_228 != '=')) {
      uStack_230 = 0x103286;
      lua_pushlstring(L,&local_228,sVar2);
    }
    else {
      uStack_230 = 0x103276;
      lua_pushfstring(L,"return %s",local_227);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int pushline (lua_State *L, int firstline) {
  char buffer[LUA_MAXINPUT];
  char *b = buffer;
  size_t l;
  const char *prmt = get_prompt(L, firstline);
  int readstatus = lua_readline(L, b, prmt);
  if (readstatus == 0)
    return 0;  /* no input (prompt will be popped by caller) */
  lua_pop(L, 1);  /* remove prompt */
  l = strlen(b);
  if (l > 0 && b[l-1] == '\n')  /* line ends with newline? */
    b[--l] = '\0';  /* remove it */
  if (firstline && b[0] == '=')  /* for compatibility with 5.2, ... */
    lua_pushfstring(L, "return %s", b + 1);  /* change '=' to 'return' */
  else
    lua_pushlstring(L, b, l);
  lua_freeline(L, b);
  return 1;
}